

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_> *
__thiscall
linq::IEnumerable<int>::Concat<linq::IEnumerable<int>&>
          (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>
           *__return_storage_ptr__,IEnumerable<int> *this,IEnumerable<int> *other)

{
  IEnumerable<int> local_30;
  
  IEnumerable(&local_30,this);
  IEnumerableCore<linq::IEnumerable<int>>::Concat<linq::IEnumerable<int>&>
            (__return_storage_ptr__,&local_30,other);
  ~IEnumerable(&local_30);
  return __return_storage_ptr__;
}

Assistant:

auto IEnumerable<T>::Concat(S2&& other) { return IEnumerableCore<IEnumerable<T>>(std::move(*this)).Concat(other); }